

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

int32_t icu_63::PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset,char *alias)

{
  UBool UVar1;
  undefined1 local_38 [8];
  BytesTrie trie;
  char *alias_local;
  int32_t bytesTrieOffset_local;
  
  trie._24_8_ = alias;
  BytesTrie::BytesTrie((BytesTrie *)local_38,&bytesTries + bytesTrieOffset);
  UVar1 = containsName((BytesTrie *)local_38,(char *)trie._24_8_);
  if (UVar1 == '\0') {
    alias_local._4_4_ = -1;
  }
  else {
    alias_local._4_4_ = BytesTrie::getValue((BytesTrie *)local_38);
  }
  BytesTrie::~BytesTrie((BytesTrie *)local_38);
  return alias_local._4_4_;
}

Assistant:

int32_t PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset, const char *alias) {
    BytesTrie trie(bytesTries+bytesTrieOffset);
    if(containsName(trie, alias)) {
        return trie.getValue();
    } else {
        return UCHAR_INVALID_CODE;
    }
}